

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_terrain.cpp
# Opt level: O0

void P_InitTerrainTypes(void)

{
  int iVar1;
  undefined1 local_118 [8];
  FScanner sc;
  int size;
  int lump;
  int lastlump;
  
  TArray<FSplashDef,_FSplashDef>::Clear(&Splashes);
  TArray<FTerrainDef,_FTerrainDef>::Clear(&Terrains);
  iVar1 = FTextureManager::NumTextures(&TexMan);
  sc._252_4_ = iVar1 + 1;
  FTerrainTypeArray::Resize(&TerrainTypes,sc._252_4_);
  FTerrainTypeArray::Clear(&TerrainTypes);
  MakeDefaultTerrain();
  size = 0;
  while( true ) {
    iVar1 = FWadCollection::FindLump(&Wads,"TERRAIN",&size,false);
    if (iVar1 == -1) break;
    FScanner::FScanner((FScanner *)local_118,iVar1);
    ParseOuter((FScanner *)local_118);
    FScanner::~FScanner((FScanner *)local_118);
  }
  TArray<FSplashDef,_FSplashDef>::ShrinkToFit(&Splashes);
  TArray<FTerrainDef,_FTerrainDef>::ShrinkToFit(&Terrains);
  return;
}

Assistant:

void P_InitTerrainTypes ()
{
	int lastlump;
	int lump;
	int size;

	Splashes.Clear();
	Terrains.Clear();
	size = (TexMan.NumTextures()+1);
	TerrainTypes.Resize(size);
	TerrainTypes.Clear();

	MakeDefaultTerrain ();

	lastlump = 0;
	while (-1 != (lump = Wads.FindLump ("TERRAIN", &lastlump)) )
	{
		FScanner sc(lump);
		ParseOuter (sc);
	}
	Splashes.ShrinkToFit ();
	Terrains.ShrinkToFit ();
}